

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O2

void pzshape::TPZShapeCube::SideShape
               (int side,TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  
  if (0x1a < (uint)side) {
    std::operator<<((ostream *)&std::cerr,"TPZCompElC3d::SideShapeFunction. Bad paramenter side.\n")
    ;
    return;
  }
  if (side == 0x1a) {
    Shape(pt,id,order,phi,dphi);
    return;
  }
  if ((uint)side < 8) {
    pdVar1 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar1 = 1.0;
    return;
  }
  if ((uint)side < 0x14) {
    TPZShapeLinear::Shape(pt,id,order,phi,dphi);
    return;
  }
  TPZShapeQuad::Shape(pt,id,order,phi,dphi);
  return;
}

Assistant:

void TPZShapeCube::SideShape(int side, TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		if(side<0 || side>26) PZError << "TPZCompElC3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==26) Shape(pt,id,order,phi,dphi);
		else if(side<8) TPZShapePoint::Shape(pt,id,order,phi,dphi);
		else if(side<20) {//8 a 19
			TPZShapeLinear::Shape(pt,id,order,phi,dphi);
		}
		else if(side<26) {//faces
			TPZShapeQuad::Shape(pt,id,order,phi,dphi);
		}
		else
		{
			Shape(pt,id,order,phi,dphi);
		}
	}